

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ManComputeCuts(Jf_Man_t *p,int fEdge)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  bool bVar7;
  double dVar8;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  int fEdge_local;
  Jf_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    uVar1 = Gia_ManCiNum(p->pGia);
    uVar2 = Gia_ManCoNum(p->pGia);
    uVar3 = Gia_ManAndNum(p->pGia);
    printf("Aig: CI = %d  CO = %d  AND = %d    ",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
    printf("LutSize = %d  CutMax = %d  Rounds = %d\n",(ulong)(uint)p->pPars->nLutSize,
           (ulong)(uint)p->pPars->nCutNum,(ulong)(uint)p->pPars->nRounds);
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  local_24 = 0;
  while( true ) {
    bVar7 = false;
    if (local_24 < p->pGia->nObjs) {
      pGStack_20 = Gia_ManObj(p->pGia,local_24);
      bVar7 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar4 = Gia_ObjIsCi(pGStack_20);
    if ((iVar4 != 0) || (iVar4 = Gia_ObjIsBuf(pGStack_20), iVar4 != 0)) {
      Jf_ObjAssignCut(p,pGStack_20);
    }
    iVar4 = Gia_ObjIsBuf(pGStack_20);
    if (iVar4 == 0) {
      iVar4 = Gia_ObjIsAnd(pGStack_20);
      if (iVar4 != 0) {
        Jf_ObjComputeCuts(p,pGStack_20,fEdge);
      }
    }
    else {
      Jf_ObjPropagateBuf(p,pGStack_20,0);
    }
    local_24 = local_24 + 1;
  }
  if (p->pPars->fVerbose != 0) {
    printf("CutPair = %lu  ",p->CutCount[0]);
    printf("Merge = %lu  ",p->CutCount[1]);
    printf("Eval = %lu  ",p->CutCount[2]);
    printf("Cut = %lu  ",p->CutCount[3]);
    aVar6 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar6 - p->clkStart);
    printf("Memory:  ");
    dVar8 = Gia_ManMemory(p->pGia);
    printf("Gia = %.2f MB  ",dVar8 / 1048576.0);
    iVar4 = Gia_ManObjNum(p->pGia);
    printf("Man = %.2f MB  ",((double)iVar4 * 24.0) / 1048576.0);
    dVar8 = Vec_ReportMemory(&p->pMem);
    printf("Cuts = %.2f MB",dVar8 / 1048576.0);
    if (p->nCoarse != 0) {
      uVar1 = p->nCoarse;
      iVar4 = p->nCoarse;
      iVar5 = Gia_ManObjNum(p->pGia);
      printf("   Coarse = %d (%.1f %%)",((double)iVar4 * 100.0) / (double)iVar5,(ulong)uVar1);
    }
    printf("\n");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Jf_ManComputeCuts( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; int i;
    if ( p->pPars->fVerbose )
    {
        printf( "Aig: CI = %d  CO = %d  AND = %d    ", Gia_ManCiNum(p->pGia), Gia_ManCoNum(p->pGia), Gia_ManAndNum(p->pGia) );
        printf( "LutSize = %d  CutMax = %d  Rounds = %d\n", p->pPars->nLutSize, p->pPars->nCutNum, p->pPars->nRounds );
        printf( "Computing cuts...\r" );
        fflush( stdout );
    }
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsBuf(pObj) )
            Jf_ObjAssignCut( p, pObj );
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 0 );
        else if ( Gia_ObjIsAnd(pObj) )
            Jf_ObjComputeCuts( p, pObj, fEdge );
    }
    if ( p->pPars->fVerbose )
    {
        printf( "CutPair = %lu  ", (long)p->CutCount[0] );
        printf( "Merge = %lu  ",   (long)p->CutCount[1] );
        printf( "Eval = %lu  ",    (long)p->CutCount[2] );
        printf( "Cut = %lu  ",     (long)p->CutCount[3] );
        Abc_PrintTime( 1, "Time",  Abc_Clock() - p->clkStart );
        printf( "Memory:  " );
        printf( "Gia = %.2f MB  ", Gia_ManMemory(p->pGia) / (1<<20) );
        printf( "Man = %.2f MB  ", 6.0 * sizeof(int) * Gia_ManObjNum(p->pGia) / (1<<20) );
        printf( "Cuts = %.2f MB",  Vec_ReportMemory(&p->pMem) / (1<<20) );
        if ( p->nCoarse )
        printf( "   Coarse = %d (%.1f %%)",  p->nCoarse, 100.0 * p->nCoarse / Gia_ManObjNum(p->pGia) );
        printf( "\n" );
        fflush( stdout );
    }
}